

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzline.h
# Opt level: O1

void pztopology::TPZLine::ComputeHCurlDirections<double>
               (TPZFMatrix<double> *gradx,TPZFMatrix<double> *directions,
               TPZVec<int> *transformationIds)

{
  long lVar1;
  double dVar2;
  
  dVar2 = (double)(int)(-(uint)(*transformationIds->fStore != 0) | 1) * 0.5;
  if (((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
     ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  *directions->fElem = dVar2;
  if ((0 < (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow) &&
     (1 < (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol)) {
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar1] = dVar2;
    if ((0 < lVar1) && (2 < (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol)) {
      directions->fElem[(directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * 2] = dVar2;
      return;
    }
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h",
             0x26d);
}

Assistant:

static constexpr MElementType Type() {return EOned;}